

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall mp::BasicSolver::PrintWarnings(BasicSolver *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string warnings;
  
  GetWarnings_abi_cxx11_(&warnings,this);
  if (warnings._M_string_length != 0) {
    std::operator+(&local_50,'\n',&warnings);
    Print<>(this,(CStringRef)local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&warnings);
  return;
}

Assistant:

void BasicSolver::PrintWarnings() {
  auto warnings = GetWarnings();
  if (warnings.size())
    Print('\n' + warnings);
}